

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O1

_Bool Curl_sasl_can_authenticate(SASL *sasl,Curl_easy *data)

{
  if ((data->state).aptr.user != (char *)0x0) {
    return true;
  }
  return SUB41(((sasl->authmechs & sasl->prefmech) & 0x20) >> 5,0);
}

Assistant:

bool Curl_sasl_can_authenticate(struct SASL *sasl, struct Curl_easy *data)
{
  /* Have credentials been provided? */
  if(data->state.aptr.user)
    return TRUE;

  /* EXTERNAL can authenticate without a username and/or password */
  if(sasl->authmechs & sasl->prefmech & SASL_MECH_EXTERNAL)
    return TRUE;

  return FALSE;
}